

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

QAccessibleInterface * __thiscall QAccessibleList::child(QAccessibleList *this,int logicalIndex)

{
  ChildCache *this_00;
  Span *pSVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  QAbstractItemView *this_01;
  QAbstractItemModel *pQVar5;
  QAccessibleTableCell *this_02;
  QListView *this_03;
  Role RVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  const_iterator cVar8;
  int copy;
  uint local_9c;
  uint local_98 [6];
  char *local_80;
  QModelIndex local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = logicalIndex;
  (**(code **)(*(long *)&(this->super_QAccessibleTable).super_QAccessibleObject + 0x18))
            (&(this->super_QAccessibleTable).super_QAccessibleObject);
  this_01 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  if (this_01 != (QAbstractItemView *)0x0) {
    pQVar5 = QAbstractItemView::model(this_01);
    if (pQVar5 != (QAbstractItemModel *)0x0) {
      iVar3 = (**(code **)(*(long *)&this->super_QAccessibleTable + 0x58))(this);
      if (iVar3 != 0) {
        this_00 = &(this->super_QAccessibleTable).childToId;
        cVar8 = QHash<int,_unsigned_int>::constFindImpl<int>(this_00,(int *)&local_3c);
        if (cVar8.i.d == (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0 && cVar8.i.bucket == 0)
        {
          this_03 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
          uVar2 = local_3c;
          uVar4 = QListView::modelColumn(this_03);
          local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          QAbstractItemView::rootIndex((QModelIndex *)&local_58,this_01);
          local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.r = -0x55555556;
          local_78.c = -0x55555556;
          local_78.i._0_4_ = 0xaaaaaaaa;
          local_78.i._4_4_ = 0xaaaaaaaa;
          (**(code **)(*(long *)pQVar5 + 0x60))
                    (&local_78,pQVar5,uVar2,uVar4,(QModelIndex *)&local_58);
          if (((local_78.r < 0) || (local_78.c < 0)) ||
             (local_78.m.ptr == (QAbstractItemModel *)0x0)) {
            local_98[0] = 2;
            local_98[1] = 0;
            local_98[2] = 0;
            local_98[3] = 0;
            local_98[4] = 0;
            local_98[5] = 0;
            local_80 = "default";
            this_02 = (QAccessibleTableCell *)0x0;
            QMessageLogger::warning
                      ((char *)local_98,"QAccessibleList::child: Invalid index at: %d %d",
                       (ulong)uVar2,(ulong)uVar4);
          }
          else {
            this_02 = (QAccessibleTableCell *)operator_new(0x38);
            RVar6 = (this->super_QAccessibleTable).m_role;
            if (RVar6 == Tree) {
              RVar6 = TreeItem;
            }
            else if (RVar6 == List) {
              RVar6 = ListItem;
            }
            else if (RVar6 == Table) {
              RVar6 = Cell;
            }
            else {
              RVar6 = NoRole;
            }
            QAccessibleTableCell::QAccessibleTableCell
                      (this_02,(QAbstractItemView *)this_01,&local_78,RVar6);
            QAccessible::registerAccessibleInterface((QAccessibleInterface *)this_02);
            local_9c = QAccessible::uniqueId((QAccessibleInterface *)this_02);
            local_98[0] = local_3c;
            QHash<int,unsigned_int>::emplace<unsigned_int_const&>
                      ((QHash<int,unsigned_int> *)this_00,(int *)local_98,&local_9c);
          }
        }
        else {
          pSVar1 = (cVar8.i.d)->spans;
          uVar7 = cVar8.i.bucket >> 7;
          this_02 = (QAccessibleTableCell *)
                    QAccessible::accessibleInterface
                              (*(uint *)(pSVar1[uVar7].entries
                                         [pSVar1[uVar7].offsets[(uint)cVar8.i.bucket & 0x7f]].
                                         storage.data + 4));
        }
        goto LAB_00535118;
      }
    }
  }
  this_02 = (QAccessibleTableCell *)0x0;
LAB_00535118:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return &this_02->super_QAccessibleInterface;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleList::child(int logicalIndex) const
{
    QAbstractItemView *theView = view();
    if (!theView)
        return nullptr;
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return nullptr;

    if (columnCount() == 0) {
        return nullptr;
    }

    const auto id = childToId.constFind(logicalIndex);
    if (id != childToId.constEnd())
        return QAccessible::accessibleInterface(id.value());

    const QListView *listView = qobject_cast<const QListView*>(theView);
    Q_ASSERT(listView);
    int row = logicalIndex;
    int column = listView->modelColumn();

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = theModel->index(row, column, rootIndex);
    if (Q_UNLIKELY(!index.isValid())) {
        qWarning("QAccessibleList::child: Invalid index at: %d %d", row, column);
        return nullptr;
    }
    const auto iface = new QAccessibleTableCell(theView, index, cellRole());

    QAccessible::registerAccessibleInterface(iface);
    childToId.insert(logicalIndex, QAccessible::uniqueId(iface));
    return iface;
}